

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall kj::anon_unknown_123::AsyncPipe::BlockedPumpTo::abortRead(BlockedPumpTo *this)

{
  PromiseFulfiller<unsigned_long> *pPVar1;
  AsyncPipe *this_00;
  char (*in_RCX) [29];
  StringPtr cancelReason;
  Array<char> AStack_1c8;
  Exception local_1b0;
  
  cancelReason.content.size_ = 0x17;
  cancelReason.content.ptr = "abortRead() was called";
  Canceler::cancel(&this->canceler,cancelReason);
  pPVar1 = this->fulfiller;
  kj::_::Debug::makeDescription<char_const(&)[29]>
            ((String *)&AStack_1c8,(Debug *)"\"read end of pipe was aborted\"",
             "read end of pipe was aborted",in_RCX);
  Exception::Exception
            (&local_1b0,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x4cd,(String *)&AStack_1c8);
  (**(pPVar1->super_PromiseRejector)._vptr_PromiseRejector)(pPVar1,&local_1b0);
  Exception::~Exception(&local_1b0);
  Array<char>::~Array(&AStack_1c8);
  this_00 = this->pipe;
  if ((BlockedPumpTo *)(this_00->state).ptr == this) {
    (this_00->state).ptr = (AsyncCapabilityStream *)0x0;
  }
  AsyncPipe::abortRead(this_00);
  return;
}

Assistant:

void abortRead() override {
      canceler.cancel("abortRead() was called");
      fulfiller.reject(KJ_EXCEPTION(DISCONNECTED, "read end of pipe was aborted"));
      pipe.endState(*this);
      pipe.abortRead();
    }